

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateCache::ExpandWithData
          (TemplateCache *this,TemplateString *filename,Strip strip,
          TemplateDictionaryInterface *dict,PerExpandData *per_expand_data,
          ExpandEmitter *expand_emitter)

{
  Template *this_00;
  bool bVar1;
  WriterMutexLock local_88;
  WriterMutexLock ml_1;
  bool result;
  WriterMutexLock local_68;
  WriterMutexLock ml;
  RefcountedTemplate *refcounted_tpl;
  undefined1 local_50 [8];
  TemplateCacheKey template_cache_key;
  ExpandEmitter *expand_emitter_local;
  PerExpandData *per_expand_data_local;
  TemplateDictionaryInterface *dict_local;
  TemplateString *pTStack_20;
  Strip strip_local;
  TemplateString *filename_local;
  TemplateCache *this_local;
  
  template_cache_key._8_8_ = expand_emitter;
  dict_local._4_4_ = strip;
  pTStack_20 = filename;
  filename_local = (TemplateString *)this;
  refcounted_tpl = (RefcountedTemplate *)TemplateString::GetGlobalId(filename);
  std::pair<unsigned_long,_int>::pair<unsigned_long,_ctemplate::Strip_&,_true>
            ((pair<unsigned_long,_int> *)local_50,(unsigned_long *)&refcounted_tpl,
             (Strip *)((long)&dict_local + 4));
  ml.mu_ = (Mutex *)0x0;
  WriterMutexLock::WriterMutexLock(&local_68,this->mutex_);
  ml.mu_ = (Mutex *)GetTemplateLocked(this,pTStack_20,dict_local._4_4_,
                                      (pair<unsigned_long,_int> *)local_50);
  bVar1 = (RefcountedTemplate *)ml.mu_ != (RefcountedTemplate *)0x0;
  if (bVar1) {
    RefcountedTemplate::IncRef((RefcountedTemplate *)ml.mu_);
  }
  else {
    this_local._7_1_ = 0;
  }
  WriterMutexLock::~WriterMutexLock(&local_68);
  if (bVar1) {
    this_00 = RefcountedTemplate::tpl((RefcountedTemplate *)ml.mu_);
    ml_1.mu_._7_1_ =
         Template::ExpandWithDataAndCache
                   (this_00,(ExpandEmitter *)template_cache_key._8_8_,dict,per_expand_data,this);
    WriterMutexLock::WriterMutexLock(&local_88,this->mutex_);
    RefcountedTemplate::DecRef((RefcountedTemplate *)ml.mu_);
    WriterMutexLock::~WriterMutexLock(&local_88);
    this_local._7_1_ = ml_1.mu_._7_1_ & 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TemplateCache::ExpandWithData(const TemplateString& filename,
                                   Strip strip,
                                   const TemplateDictionaryInterface *dict,
                                   PerExpandData *per_expand_data,
                                   ExpandEmitter *expand_emitter) {
  TemplateCacheKey template_cache_key(filename.GetGlobalId(), strip);
  // We make a local copy of this struct so we don't have to worry about
  // what happens to our cache while we don't hold the lock (during Expand).
  RefcountedTemplate* refcounted_tpl = NULL;
  {
    WriterMutexLock ml(mutex_);
    // Optionally load the template (depending on whether the cache is frozen,
    // the reload bit is set etc.)
    refcounted_tpl = GetTemplateLocked(filename, strip, template_cache_key);
    if (!refcounted_tpl)
      return false;
    refcounted_tpl->IncRef();
  }
  const bool result = refcounted_tpl->tpl()->ExpandWithDataAndCache(
      expand_emitter, dict, per_expand_data, this);
  {
    WriterMutexLock ml(mutex_);
    refcounted_tpl->DecRef();
  }
  return result;
}